

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O0

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::create_page(LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
              *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  progress_guarantee i_progress_guarantee_00;
  ControlBlock *i_atomic;
  bad_alloc *this_00;
  void *local_38;
  ControlBlock *new_page_end_block;
  ControlBlock *new_page;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  
  if (i_progress_guarantee == LfQueue_Throwing) {
    local_38 = basic_default_allocator<65536UL>::allocate_page_zeroed
                         ((basic_default_allocator<65536UL> *)this);
  }
  else {
    i_progress_guarantee_00 = ToDenGuarantee(i_progress_guarantee);
    local_38 = basic_default_allocator<65536UL>::try_allocate_page_zeroed
                         ((basic_default_allocator<65536UL> *)this,i_progress_guarantee_00);
  }
  if (local_38 == (void *)0x0) {
    if (i_progress_guarantee == LfQueue_Throwing) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else {
    i_atomic = LFQueue_Base<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
               ::get_end_control_block(local_38);
    raw_atomic_store(&i_atomic->m_next,8,memory_order_seq_cst);
  }
  return (uintptr_t)local_38;
}

Assistant:

uintptr_t create_page(LfQueue_ProgressGuarantee const i_progress_guarantee)
            {
                auto const new_page = static_cast<ControlBlock *>(
                  i_progress_guarantee == LfQueue_Throwing
                    ? ALLOCATOR_TYPE::allocate_page_zeroed()
                    : ALLOCATOR_TYPE::try_allocate_page_zeroed(
                        ToDenGuarantee(i_progress_guarantee)));
                if (new_page != nullptr)
                {
                    ControlBlock * const new_page_end_block = get_end_control_block(new_page);
                    raw_atomic_store(
                      &new_page_end_block->m_next, uintptr_t(LfQueue_InvalidNextPage));
                }
                else
                {
                    if (i_progress_guarantee == LfQueue_Throwing)
                    {
                        throw std::bad_alloc();
                    }
                }
                return reinterpret_cast<uintptr_t>(new_page);
            }